

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::sleep_for_next_event
          (thread_impl_template<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,lock_guard *lock)

{
  timer_type *ptVar1;
  time_point time_point;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_8;
  
  if (this->m_shutdown == false) {
    ptVar1 = (this->
             super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
             ).m_engine.m_head;
    if (ptVar1 == (timer_type *)0x0) {
      std::condition_variable::wait
                ((unique_lock *)
                 &(this->
                  super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                  ).super_type.m_condition);
      return;
    }
    local_8.__d.__r = (duration)(ptVar1->m_when).__d.__r;
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&(this->
                super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                ).super_type.m_condition,&lock->m_lock,&local_8);
  }
  return;
}

Assistant:

void
	sleep_for_next_event(
		//! Object's lock.
		//! The lock is necessary for waiting on condition variable.
		typename base_type::lock_guard & lock )
	{
		if( !this->m_shutdown )
		{
			if( !this->m_engine.empty() )
			{
				auto time_point = this->m_engine.nearest_time_point();
				this->m_condition.wait_until( lock.actual_lock(), time_point );
			}
			else
				this->m_condition.wait( lock.actual_lock() );
		}
	}